

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall
kj::_::RaceSuccessfulPromiseNodeBase::Branch::Branch
          (Branch *this,RaceSuccessfulPromiseNodeBase *parent,OwnPromiseNode *dependencyParam,
          SourceLocation location)

{
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *other;
  PromiseNode *pPVar1;
  OwnPromiseNode *dependencyParam_local;
  RaceSuccessfulPromiseNodeBase *parent_local;
  Branch *this_local;
  
  Event::Event(&this->super_Event,location);
  (this->super_Event)._vptr_Event = (_func_int **)&PTR_traceEvent_00d9abc8;
  this->parent = parent;
  other = mv<kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>>(dependencyParam);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::Own(&this->promise,other);
  pPVar1 = Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator->(&this->promise);
  (*(pPVar1->super_PromiseArenaMember)._vptr_PromiseArenaMember[2])();
  pPVar1 = Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator->(&this->promise);
  (*(pPVar1->super_PromiseArenaMember)._vptr_PromiseArenaMember[1])(pPVar1,this);
  return;
}

Assistant:

RaceSuccessfulPromiseNodeBase::Branch::Branch(
    RaceSuccessfulPromiseNodeBase &parent, OwnPromiseNode dependencyParam,
    SourceLocation location)
    : Event(location), parent(parent), promise(kj::mv(dependencyParam)) {
  promise->setSelfPointer(&promise);
  promise->onReady(this);
}